

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

BrotliDecoderErrorCode
duckdb_brotli::DecodeMetaBlockLength(BrotliDecoderStateInternal *s,BrotliBitReader *br)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  BrotliRunningMetablockHeaderState BVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint64_t uVar9;
  
  BVar4 = s->substate_metablock_header;
  do {
    switch(BVar4) {
    case BROTLI_STATE_METABLOCK_HEADER_NONE:
      if (br->bit_pos_ == 0) {
        pbVar1 = br->next_in;
        if (pbVar1 == br->last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar3 = (ulong)*pbVar1 | br->val_;
        br->next_in = pbVar1 + 1;
        uVar9 = 7;
      }
      else {
        uVar3 = br->val_;
        uVar9 = br->bit_pos_ - 1;
      }
      br->bit_pos_ = uVar9;
      br->val_ = uVar3 >> 1;
      s->meta_block_remaining_len = 0;
      *(uint *)&s->field_0x304 = *(uint *)&s->field_0x304 & 0xfffffff8 | (uint)uVar3 & 1;
      BVar4 = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      if ((uVar3 & 1) != 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        goto switchD_00329fd7_caseD_1;
      }
      goto LAB_0032a130;
    case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
switchD_00329fd7_caseD_1:
      if (br->bit_pos_ == 0) {
        pbVar1 = br->next_in;
        if (pbVar1 == br->last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar9 = (ulong)*pbVar1 | br->val_;
        br->next_in = pbVar1 + 1;
        uVar3 = 7;
      }
      else {
        uVar9 = br->val_;
        uVar3 = br->bit_pos_ - 1;
      }
      br->bit_pos_ = uVar3;
      br->val_ = uVar9 >> 1;
      if ((uVar9 & 1) != 0) goto LAB_0032a409;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
      uVar3 = br->bit_pos_;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_SIZE:
      goto switchD_00329fd7_caseD_3;
    case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
      uVar7 = *(uint *)&s->field_0x304;
      goto LAB_0032a23b;
    case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
      if (br->bit_pos_ == 0) {
        pbVar1 = br->next_in;
        if (pbVar1 == br->last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar2 = (ulong)*pbVar1 | br->val_;
        br->next_in = pbVar1 + 1;
        uVar3 = 7;
      }
      else {
        uVar2 = br->val_;
        uVar3 = br->bit_pos_ - 1;
      }
      br->bit_pos_ = uVar3;
      br->val_ = uVar2 >> 1;
      if ((uVar2 & 1) != 0) {
        return BROTLI_DECODER_ERROR_FORMAT_RESERVED;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
      goto LAB_0032a2f0;
    case BROTLI_STATE_METABLOCK_HEADER_BYTES:
      uVar3 = br->bit_pos_;
LAB_0032a2f0:
      if (uVar3 < 2) {
        pbVar1 = br->next_in;
        if (pbVar1 == br->last_in) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar2 = (ulong)*pbVar1 << ((byte)uVar3 & 0x3f) | br->val_;
        uVar3 = uVar3 | 8;
        br->next_in = pbVar1 + 1;
      }
      else {
        uVar2 = br->val_;
      }
      br->bit_pos_ = uVar3 - 2;
      br->val_ = uVar2 >> 2;
      if ((uVar2 & 3) == 0) goto LAB_0032a409;
      uVar7 = *(uint *)&s->field_0x304 & 0xfff00fff | (int)(uVar2 & 3) << 0xc;
      *(uint *)&s->field_0x304 = uVar7;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
LAB_0032a359:
      uVar6 = s->loop_counter;
      if ((int)uVar6 < (int)(uVar7 >> 0xc & 0xff)) {
        uVar3 = br->bit_pos_;
        iVar5 = uVar6 * 8;
        goto LAB_0032a378;
      }
      uVar7 = s->meta_block_remaining_len;
      goto LAB_0032a3ff;
    case BROTLI_STATE_METABLOCK_HEADER_METADATA:
      uVar7 = *(uint *)&s->field_0x304;
      goto LAB_0032a359;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
    if (uVar3 < 2) {
      pbVar1 = br->next_in;
      if (pbVar1 == br->last_in) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar9 = (ulong)*pbVar1 << ((byte)uVar3 & 0x3f) | br->val_;
      uVar3 = uVar3 | 8;
      br->next_in = pbVar1 + 1;
    }
    else {
      uVar9 = br->val_;
    }
    uVar6 = (uint)uVar9 & 3;
    br->bit_pos_ = uVar3 - 2;
    br->val_ = uVar9 >> 2;
    uVar7 = uVar6 * 0x1000 + (*(uint *)&s->field_0x304 & 0xfff00fff) + 0x4000;
    *(uint *)&s->field_0x304 = uVar7;
    s->loop_counter = 0;
    if (uVar6 != 3) {
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
      uVar6 = 0;
      goto LAB_0032a18d;
    }
    *(uint *)&s->field_0x304 = uVar7 | 4;
    BVar4 = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
LAB_0032a130:
    s->substate_metablock_header = BVar4;
  } while( true );
  while( true ) {
    uVar3 = uVar3 - 8;
    br->bit_pos_ = uVar3;
    br->val_ = uVar9 >> 8;
    uVar6 = uVar6 + 1;
    uVar8 = *(uint *)&s->field_0x304 >> 0xc & 0xff;
    if (((uVar6 == uVar8) && (1 < uVar6)) && ((uVar9 & 0xff) == 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE;
    }
    uVar7 = (uint)((uVar9 & 0xff) << ((byte)iVar5 & 0x3f)) | s->meta_block_remaining_len;
    s->meta_block_remaining_len = uVar7;
    iVar5 = iVar5 + 8;
    if ((int)uVar8 <= (int)uVar6) break;
LAB_0032a378:
    if (uVar3 < 8) {
      pbVar1 = br->next_in;
      if (pbVar1 == br->last_in) goto LAB_0032a419;
      uVar9 = (ulong)*pbVar1 << ((byte)uVar3 & 0x3f) | br->val_;
      uVar3 = uVar3 | 8;
      br->next_in = pbVar1 + 1;
    }
    else {
      uVar9 = br->val_;
    }
  }
LAB_0032a3ff:
  s->meta_block_remaining_len = uVar7 + 1;
  goto LAB_0032a409;
switchD_00329fd7_caseD_3:
  uVar6 = s->loop_counter;
  uVar7 = *(uint *)&s->field_0x304;
LAB_0032a18d:
  if ((int)uVar6 < (int)(uVar7 >> 0xc & 0xff)) {
    uVar3 = br->bit_pos_;
    iVar5 = uVar6 * 4;
    do {
      if (uVar3 < 4) {
        pbVar1 = br->next_in;
        if (pbVar1 == br->last_in) {
LAB_0032a419:
          s->loop_counter = uVar6;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar9 = (ulong)*pbVar1 << ((byte)uVar3 & 0x3f) | br->val_;
        uVar3 = uVar3 | 8;
        br->next_in = pbVar1 + 1;
      }
      else {
        uVar9 = br->val_;
      }
      uVar3 = uVar3 - 4;
      br->bit_pos_ = uVar3;
      br->val_ = uVar9 >> 4;
      uVar6 = uVar6 + 1;
      uVar7 = *(uint *)&s->field_0x304;
      uVar8 = uVar7 >> 0xc & 0xff;
      if (((uVar6 == uVar8) && (4 < uVar6)) && ((uVar9 & 0xf) == 0)) {
        return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
      }
      s->meta_block_remaining_len =
           s->meta_block_remaining_len | ((uint)uVar9 & 0xf) << ((byte)iVar5 & 0x3f);
      iVar5 = iVar5 + 4;
    } while ((int)uVar6 < (int)uVar8);
  }
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
LAB_0032a23b:
  if ((uVar7 & 1) == 0) {
    if (br->bit_pos_ == 0) {
      pbVar1 = br->next_in;
      if (pbVar1 == br->last_in) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar3 = (ulong)*pbVar1 | br->val_;
      br->next_in = pbVar1 + 1;
      uVar9 = 7;
    }
    else {
      uVar3 = br->val_;
      uVar9 = br->bit_pos_ - 1;
    }
    br->bit_pos_ = uVar9;
    br->val_ = uVar3 >> 1;
    *(uint *)&s->field_0x304 = (*(uint *)&s->field_0x304 & 0xfffffffd) + ((uint)uVar3 & 1) * 2;
  }
  s->meta_block_remaining_len = s->meta_block_remaining_len + 1;
LAB_0032a409:
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE DecodeMetaBlockLength(BrotliDecoderState *s, BrotliBitReader *br) {
	brotli_reg_t bits;
	int i;
	for (;;) {
		switch (s->substate_metablock_header) {
		case BROTLI_STATE_METABLOCK_HEADER_NONE:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->is_last_metablock = bits ? 1 : 0;
			s->meta_block_remaining_len = 0;
			s->is_uncompressed = 0;
			s->is_metadata = 0;
			if (!s->is_last_metablock) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
				break;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
				return BROTLI_DECODER_SUCCESS;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
			if (!BrotliSafeReadBits(br, 2, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->size_nibbles = (uint8_t)(bits + 4);
			s->loop_counter = 0;
			if (bits == 3) {
				s->is_metadata = 1;
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
				break;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_SIZE:
			i = s->loop_counter;
			for (; i < (int)s->size_nibbles; ++i) {
				if (!BrotliSafeReadBits(br, 4, &bits)) {
					s->loop_counter = i;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 4 && bits == 0) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE);
				}
				s->meta_block_remaining_len |= (int)(bits << (i * 4));
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
			if (!s->is_last_metablock) {
				if (!BrotliSafeReadBits(br, 1, &bits)) {
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				s->is_uncompressed = bits ? 1 : 0;
			}
			++s->meta_block_remaining_len;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
			return BROTLI_DECODER_SUCCESS;

		case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits != 0) {
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_RESERVED);
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_BYTES:
			if (!BrotliSafeReadBits(br, 2, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits == 0) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
				return BROTLI_DECODER_SUCCESS;
			}
			s->size_nibbles = (uint8_t)bits;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_METADATA:
			i = s->loop_counter;
			for (; i < (int)s->size_nibbles; ++i) {
				if (!BrotliSafeReadBits(br, 8, &bits)) {
					s->loop_counter = i;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 1 && bits == 0) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE);
				}
				s->meta_block_remaining_len |= (int)(bits << (i * 8));
			}
			++s->meta_block_remaining_len;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
			return BROTLI_DECODER_SUCCESS;

		default:
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
		}
	}
}